

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void __thiscall ncnn::Mat::create_like(Mat *this,Mat *m,Allocator *_allocator)

{
  size_t in_RDX;
  Mat *in_RSI;
  size_t in_RDI;
  Mat *unaff_retaddr;
  int _dims;
  int in_stack_00000050;
  Allocator *in_stack_00000058;
  Allocator *in_stack_00000060;
  int in_stack_ffffffffffffffe0;
  int iVar1;
  size_t sVar2;
  
  iVar1 = in_RSI->dims;
  sVar2 = in_RDI;
  if (iVar1 == 1) {
    create(unaff_retaddr,(int)(in_RDI >> 0x20),(size_t)in_RSI,(int)(in_RDX >> 0x20),
           (Allocator *)CONCAT44(1,in_stack_ffffffffffffffe0));
  }
  if (iVar1 == 2) {
    create(unaff_retaddr,(int)(sVar2 >> 0x20),(int)sVar2,(size_t)in_RSI,(int)(in_RDX >> 0x20),
           (Allocator *)CONCAT44(2,in_stack_ffffffffffffffe0));
  }
  if (iVar1 == 3) {
    create(unaff_retaddr,(int)(sVar2 >> 0x20),(int)sVar2,(int)((ulong)in_RSI >> 0x20),in_RDX,3,
           in_stack_00000060);
  }
  if (iVar1 == 4) {
    create(in_RSI,(int)(in_RDX >> 0x20),(int)in_RDX,4,in_stack_ffffffffffffffe0,in_RDI,
           in_stack_00000050,in_stack_00000058);
  }
  return;
}

Assistant:

void Mat::create_like(const Mat& m, Allocator* _allocator)
{
    int _dims = m.dims;
    if (_dims == 1)
        create(m.w, m.elemsize, m.elempack, _allocator);
    if (_dims == 2)
        create(m.w, m.h, m.elemsize, m.elempack, _allocator);
    if (_dims == 3)
        create(m.w, m.h, m.c, m.elemsize, m.elempack, _allocator);
    if (_dims == 4)
        create(m.w, m.h, m.d, m.c, m.elemsize, m.elempack, _allocator);
}